

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O3

Violation mp::
          ComputeViolation<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId,mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
                    (CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>
                     *c,VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *x)

{
  double dVar1;
  int iVar2;
  CtxVal CVar3;
  pointer pdVar4;
  int *piVar5;
  int *piVar6;
  double dVar7;
  double dVar8;
  Violation VVar9;
  Violation VVar10;
  Violation VVar11;
  
  iVar2 = (c->super_FunctionalConstraint).result_var_;
  pdVar4 = (x->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar1 = pdVar4[iVar2];
  if (x->recomp_vals_ == false) {
    piVar6 = (c->
             super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::MaxId>
             ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    piVar5 = (c->
             super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::MaxId>
             ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    if (piVar6 == piVar5) {
      dVar7 = -INFINITY;
    }
    else {
      dVar7 = -INFINITY;
      do {
        dVar8 = pdVar4[*piVar6];
        if (dVar8 <= dVar7) {
          dVar8 = dVar7;
        }
        dVar7 = dVar8;
        piVar6 = piVar6 + 1;
      } while (piVar6 != piVar5);
    }
    dVar7 = dVar1 - dVar7;
    CVar3 = (c->super_FunctionalConstraint).ctx.value_;
    if (CVar3 != CTX_POS) {
      if (CVar3 == CTX_NEG) {
        VVar11.viol_ = -dVar7;
        VVar11.valX_ = dVar1;
        return VVar11;
      }
      if (CVar3 != CTX_MIX) {
        return (Violation)ZEXT816(0x7ff0000000000000);
      }
      VVar10.viol_ = ABS(dVar7);
      VVar10.valX_ = dVar1;
      return VVar10;
    }
  }
  else {
    dVar8 = (x->lb_).data_[iVar2] - dVar1;
    dVar7 = dVar1 - (x->ub_).data_[iVar2];
    if (dVar7 <= dVar8) {
      dVar7 = dVar8;
    }
    if (dVar7 <= 0.0) {
      dVar7 = 0.0;
    }
    dVar7 = dVar7 + ABS(dVar1 - (x->x_raw_).data_[iVar2]);
  }
  VVar9.valX_ = dVar1;
  VVar9.viol_ = dVar7;
  return VVar9;
}

Assistant:

int GetResultVar() const { return result_var_; }